

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits_test.cpp
# Opt level: O3

void __thiscall Morton2_Basics_Test::TestBody(Morton2_Basics_Test *this)

{
  bool bVar1;
  byte bVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  AssertionResult gtest_ar;
  uint32_t yp;
  uint32_t xp;
  uint32_t y;
  uint32_t x;
  uint32_t m;
  Message local_68;
  AssertHelper local_60;
  internal local_58 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38 [2];
  
  local_38[1] = 0xb137;
  local_68.ss_.ptr_._0_4_ = 0xb137;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            (local_58,"m","0b1011000100110111",local_38 + 1,(int *)&local_68);
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message(&local_68);
    if (local_50.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_50.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/bits_test.cpp"
               ,0x3f,pcVar6);
    testing::internal::AssertHelper::operator=(&local_60,&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (CONCAT44(local_68.ss_.ptr_._4_4_,local_68.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_68.ss_.ptr_._4_4_,local_68.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_68.ss_.ptr_._4_4_,local_68.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  iVar5 = 100000;
  uVar7 = 0x266662fe23a90753;
  do {
    uVar8 = uVar7 * 0x5851f42d4c957f2d + 0x607f;
    uVar4 = (uint)(uVar7 >> 0x2d) ^ (uint)(uVar7 >> 0x1b);
    bVar2 = (byte)(uVar7 >> 0x3b);
    local_38[0] = uVar4 >> bVar2 | uVar4 << 0x20 - bVar2;
    uVar4 = (uint)(uVar8 >> 0x2d) ^ (uint)(uVar8 >> 0x1b);
    bVar2 = (byte)(uVar8 >> 0x3b);
    local_3c = uVar4 >> bVar2 | uVar4 << 0x20 - bVar2;
    uVar7 = ((ulong)local_3c << 0x10 | (ulong)local_3c) & 0xffff0000ffff;
    uVar7 = (uVar7 << 8 | uVar7) & 0xff00ff00ff00ff;
    uVar7 = (uVar7 << 4 | uVar7) & 0xf0f0f0f0f0f0f0f;
    uVar7 = (uVar7 * 2 | uVar7 * 8) & 0x6666666666666666;
    uVar3 = ((ulong)local_38[0] << 0x10 | (ulong)local_38[0]) & 0xffff0000ffff;
    uVar3 = (uVar3 << 8 | uVar3) & 0xff00ff00ff00ff;
    uVar3 = (uVar3 << 4 | uVar3) & 0xf0f0f0f0f0f0f0f;
    uVar3 = (uVar3 * 4 | uVar3) & 0x3333333333333333;
    uVar3 = (uVar3 * 2 | uVar3) & 0x5555555555555555;
    uVar3 = (uVar3 >> 1 | uVar3) & 0x3333333333333333;
    uVar3 = (uVar3 >> 2 | uVar3) & 0xf0f0f0f0f0f0f0f;
    uVar3 = (uVar3 >> 4 | uVar3) & 0xff00ff00ff00ff;
    uVar3 = uVar3 >> 8 | uVar3;
    local_40 = (uint)uVar3 & 0xffff | (uint)(uVar3 >> 0x10) & 0xffff0000;
    uVar7 = (uVar7 >> 3 | uVar7 >> 1) & 0xf0f0f0f0f0f0f0f;
    uVar7 = (uVar7 >> 4 | uVar7) & 0xff00ff00ff00ff;
    uVar7 = uVar7 >> 8 | uVar7;
    local_44 = (uint)uVar7 & 0xffff | (uint)(uVar7 >> 0x10) & 0xffff0000;
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>(local_58,"x","xp",local_38,&local_40);
    if (local_58[0] == (internal)0x0) {
      testing::Message::Message(&local_68);
      pcVar6 = "";
      if (local_50.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar6 = ((local_50.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/bits_test.cpp"
                 ,0x55,pcVar6);
      testing::internal::AssertHelper::operator=(&local_60,&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      if (CONCAT44(local_68.ss_.ptr_._4_4_,local_68.ss_.ptr_._0_4_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           ((long *)CONCAT44(local_68.ss_.ptr_._4_4_,local_68.ss_.ptr_._0_4_) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(local_68.ss_.ptr_._4_4_,local_68.ss_.ptr_._0_4_) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>(local_58,"y","yp",&local_3c,&local_44)
    ;
    if (local_58[0] == (internal)0x0) {
      testing::Message::Message(&local_68);
      pcVar6 = "";
      if (local_50.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar6 = ((local_50.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/bits_test.cpp"
                 ,0x56,pcVar6);
      testing::internal::AssertHelper::operator=(&local_60,&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      if (CONCAT44(local_68.ss_.ptr_._4_4_,local_68.ss_.ptr_._0_4_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           ((long *)CONCAT44(local_68.ss_.ptr_._4_4_,local_68.ss_.ptr_._0_4_) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(local_68.ss_.ptr_._4_4_,local_68.ss_.ptr_._0_4_) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    uVar7 = uVar8 * 0x5851f42d4c957f2d + 0x607f;
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  return;
}

Assistant:

TEST(Morton2, Basics) {
    uint16_t x = 0b01010111, y = 0b11000101;
    uint32_t m = EncodeMorton2(x, y);
    EXPECT_EQ(m, 0b1011000100110111);

#if 0
    for (int x = 0; x <= 65535; ++x)
        for (int y = 0; y <= 65535; ++y) {
            uint32_t m = EncodeMorton2(x, y);
            uint16_t xp, yp;
            DecodeMorton2(m, &xp, &yp);

            EXPECT_EQ(x, xp);
            EXPECT_EQ(y, yp);
        }
#endif

    RNG rng(12351);
    for (int i = 0; i < 100000; ++i) {
        uint32_t x = rng.Uniform<uint32_t>();
        uint32_t y = rng.Uniform<uint32_t>();
        uint64_t m = EncodeMorton2(x, y);

        uint32_t xp, yp;
        DecodeMorton2(m, &xp, &yp);
        EXPECT_EQ(x, xp);
        EXPECT_EQ(y, yp);
    }
}